

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

void N_VDestroy_Serial(N_Vector v)

{
  void *__ptr;
  
  if (v != (N_Vector)0x0) {
    __ptr = v->content;
    if (__ptr != (void *)0x0) {
      if ((*(int *)((long)__ptr + 8) != 0) && (*(void **)((long)__ptr + 0x10) != (void *)0x0)) {
        free(*(void **)((long)__ptr + 0x10));
        __ptr = v->content;
        *(undefined8 *)((long)__ptr + 0x10) = 0;
      }
      free(__ptr);
      v->content = (void *)0x0;
    }
    free(v->ops);
    free(v);
    return;
  }
  return;
}

Assistant:

void N_VDestroy_Serial(N_Vector v)
{
  if (v == NULL) { return; }

  /* free content */
  if (v->content != NULL)
  {
    /* free data array if it's owned by the vector */
    if (NV_OWN_DATA_S(v) && NV_DATA_S(v) != NULL)
    {
      free(NV_DATA_S(v));
      NV_DATA_S(v) = NULL;
    }
    free(v->content);
    v->content = NULL;
  }

  /* free ops and vector */
  if (v->ops != NULL)
  {
    free(v->ops);
    v->ops = NULL;
  }
  free(v);
  v = NULL;

  return;
}